

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_InsertConversion_KeyMoveCount_Test::TestBody
          (DenseHashMapMoveTest_InsertConversion_KeyMoveCount_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  h;
  pair<int,_int> *in_stack_fffffffffffffe58;
  allocator_type *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  hasher *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int line;
  dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *in_stack_fffffffffffffe80;
  Type in_stack_fffffffffffffe8c;
  Type type;
  AssertHelper *in_stack_fffffffffffffe90;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertionResult local_108 [2];
  undefined4 local_e4;
  AssertionResult local_e0;
  uint local_cc;
  undefined4 local_b4;
  AssertionResult local_b0 [3];
  undefined4 local_80;
  undefined4 local_7c;
  pair<int,_int> local_78;
  A local_70 [5];
  libc_allocator_with_realloc<std::pair<const_A,_int>_> local_5b [91];
  
  google::libc_allocator_with_realloc<std::pair<const_A,_int>_>::libc_allocator_with_realloc
            (local_5b);
  google::
  dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::dense_hash_map(in_stack_fffffffffffffe80,
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   in_stack_fffffffffffffe70,
                   (key_equal *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                   in_stack_fffffffffffffe60);
  google::libc_allocator_with_realloc<std::pair<const_A,_int>_>::~libc_allocator_with_realloc
            (local_5b);
  A::A(local_70,0);
  google::
  dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::set_empty_key((dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                   *)in_stack_fffffffffffffe60,(key_type *)in_stack_fffffffffffffe58);
  A::reset();
  local_7c = 2;
  local_80 = 2;
  local_78 = std::make_pair<int,int>(&in_stack_fffffffffffffe58->first,(int *)0x107c0c0);
  google::
  dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>
  ::insert<std::pair<int,int>,void>
            ((dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
              *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_b4 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
             (char *)in_stack_fffffffffffffe70,
             (int *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
             (int *)in_stack_fffffffffffffe60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffe90 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x107c1c0);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,(char *)in_stack_fffffffffffffe80
               ,in_stack_fffffffffffffe7c,(char *)in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0x107c21d);
  }
  local_cc = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x107c28b);
  if (local_cc == 0) {
    local_e4 = 0;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
               (char *)in_stack_fffffffffffffe70,
               (int *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
               (int *)in_stack_fffffffffffffe60);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe8c);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe80 =
           (dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0x107c33c);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe90,type,(char *)in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe7c,(char *)in_stack_fffffffffffffe70);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
      testing::Message::~Message((Message *)0x107c399);
    }
    local_cc = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x107c407);
    if (local_cc == 0) {
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 (char *)in_stack_fffffffffffffe70,
                 (int *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                 (int *)in_stack_fffffffffffffe60);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_108);
      line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe7c);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        in_stack_fffffffffffffe70 =
             (hasher *)testing::AssertionResult::failure_message((AssertionResult *)0x107c4b8);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe90,type,(char *)in_stack_fffffffffffffe80,line,
                   (char *)in_stack_fffffffffffffe70);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8._M_head_impl);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
        testing::Message::~Message((Message *)0x107c515);
      }
      local_cc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x107c580);
      if (local_cc == 0) {
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((char *)CONCAT44(line,in_stack_fffffffffffffe78),
                   (char *)in_stack_fffffffffffffe70,
                   (int *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                   (int *)in_stack_fffffffffffffe60);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffed0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe90);
          this_00 = (AssertHelper *)
                    testing::AssertionResult::failure_message((AssertionResult *)0x107c61f);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe90,type,(char *)in_stack_fffffffffffffe80,line,
                     (char *)in_stack_fffffffffffffe70);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffee0,(Message *)in_stack_fffffffffffffed8._M_head_impl);
          testing::internal::AssertHelper::~AssertHelper(this_00);
          testing::Message::~Message((Message *)0x107c66d);
        }
        local_cc = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x107c6cf);
        if (local_cc == 0) {
          local_cc = 0;
        }
      }
    }
  }
  google::
  dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  ::~dense_hash_map((dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                     *)0x107c6f4);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, InsertConversion_KeyMoveCount)
{
    dense_hash_map<A, int, HashA> h;
    h.set_empty_key(A(0));

    A::reset();
    h.insert(std::make_pair(2, 2));

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(0, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}